

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O1

void Llb_MtrRemoveSingletonRows(Llb_Mtr_t *p)

{
  long lVar1;
  long lVar2;
  
  if (0 < p->nRows) {
    lVar1 = 0;
    do {
      if ((p->pRowSums[lVar1] < 2) && (p->pRowSums[lVar1] = 0, 0 < p->nCols)) {
        lVar2 = 0;
        do {
          if (p->pMatrix[lVar2][lVar1] == '\x01') {
            p->pMatrix[lVar2][lVar1] = '\0';
            p->pColSums[lVar2] = p->pColSums[lVar2] + -1;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 < p->nCols);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < p->nRows);
  }
  return;
}

Assistant:

void Llb_MtrRemoveSingletonRows( Llb_Mtr_t * p )
{
    int i, k;
    for ( i = 0; i < p->nRows; i++ )
        if ( p->pRowSums[i] < 2 )
        {
            p->pRowSums[i] = 0;
            for ( k = 0; k < p->nCols; k++ )
            {
                if ( p->pMatrix[k][i] == 1 )
                {
                    p->pMatrix[k][i] = 0;
                    p->pColSums[k]--;
                }
            }
        }
}